

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_decoder_impl.cc
# Opt level: O0

bool __thiscall
draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::
DecodeConnectivity(MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>
                   *this)

{
  bool bVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  uint uVar5;
  int32_t iVar6;
  int iVar7;
  int iVar8;
  DecoderBuffer *pDVar9;
  int64_t iVar10;
  char *pcVar11;
  size_t data_size;
  DecoderBuffer *this_00;
  ulong uVar12;
  size_type sVar13;
  reference pvVar14;
  uint *puVar15;
  long in_RDI;
  int32_t att_connectivity_verts;
  uint32_t i_1;
  int32_t c;
  iterator __end0;
  iterator __begin0;
  vector<int,_std::allocator<int>_> *__range3;
  uint32_t i;
  CornerIndex ci_1;
  CornerIndex ci;
  int num_connectivity_verts;
  DecoderBuffer traversal_end_buffer;
  DecoderBuffer event_buffer;
  uint32_t encoded_connectivity_size;
  int32_t topology_split_decoded_bytes;
  uint32_t num_encoded_split_symbols;
  uint32_t max_encoded_faces;
  uint32_t num_encoded_symbols;
  uint8_t num_attribute_data;
  uint64_t max_num_vertex_edges;
  uint64_t num_encoded_vertices_64;
  uint32_t min_num_face_edges;
  uint32_t num_faces;
  uint32_t num_encoded_vertices;
  uint32_t num_new_verts;
  int in_stack_00000654;
  MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder> *in_stack_00000658;
  undefined4 in_stack_fffffffffffffdb8;
  int in_stack_fffffffffffffdbc;
  int in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
  *in_stack_fffffffffffffdd0;
  CornerTable *in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  MeshAttributeCornerTable *in_stack_fffffffffffffde8;
  CornerTable *in_stack_fffffffffffffdf0;
  undefined2 in_stack_fffffffffffffe1c;
  DecoderBuffer *in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe28;
  undefined2 in_stack_fffffffffffffe2c;
  undefined2 in_stack_fffffffffffffe2e;
  MeshAttributeCornerTable *in_stack_fffffffffffffea8;
  ulong in_stack_fffffffffffffeb0;
  uint local_12c;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_128;
  uint local_124;
  int *local_120;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_118;
  vector<int,_std::allocator<int>_> *local_110;
  uint local_108;
  uint local_104;
  uint local_100;
  uint local_fc;
  uint local_f8;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_f4;
  uint local_f0;
  uint local_ec;
  uint local_e8;
  uint local_e4;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_e0;
  int local_dc;
  DecoderBuffer local_d8;
  uint local_9c;
  DecoderBuffer local_98;
  uint local_60;
  int32_t local_5c;
  undefined1 local_55;
  int in_stack_ffffffffffffffb4;
  MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>
  *in_stack_ffffffffffffffb8;
  uint local_40;
  uint local_38;
  byte local_31;
  uint local_1c;
  undefined4 local_18;
  undefined4 local_14;
  byte local_1;
  
  *(undefined4 *)(in_RDI + 0x140) = 0;
  std::
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::clear((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
           *)0x15b405);
  uVar2 = PointCloudDecoder::bitstream_version(*(PointCloudDecoder **)(in_RDI + 8));
  if (uVar2 < 0x202) {
    uVar2 = PointCloudDecoder::bitstream_version(*(PointCloudDecoder **)(in_RDI + 8));
    if (uVar2 < 0x200) {
      PointCloudDecoder::buffer(*(PointCloudDecoder **)(in_RDI + 8));
      bVar1 = DecoderBuffer::Decode<unsigned_int>
                        ((DecoderBuffer *)
                         CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                         (uint *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
      if (!bVar1) {
        local_1 = 0;
        goto LAB_0015c534;
      }
    }
    else {
      PointCloudDecoder::buffer(*(PointCloudDecoder **)(in_RDI + 8));
      bVar1 = DecodeVarint<unsigned_int>
                        ((uint *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                         (DecoderBuffer *)0x15b494);
      if (!bVar1) {
        local_1 = 0;
        goto LAB_0015c534;
      }
    }
    *(undefined4 *)(in_RDI + 0x140) = local_14;
  }
  uVar2 = PointCloudDecoder::bitstream_version(*(PointCloudDecoder **)(in_RDI + 8));
  if (uVar2 < 0x200) {
    PointCloudDecoder::buffer(*(PointCloudDecoder **)(in_RDI + 8));
    bVar1 = DecoderBuffer::Decode<unsigned_int>
                      ((DecoderBuffer *)
                       CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                       (uint *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
    if (!bVar1) {
      local_1 = 0;
      goto LAB_0015c534;
    }
  }
  else {
    PointCloudDecoder::buffer(*(PointCloudDecoder **)(in_RDI + 8));
    bVar1 = DecodeVarint<unsigned_int>
                      ((uint *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                       (DecoderBuffer *)0x15b52c);
    if (!bVar1) {
      local_1 = 0;
      goto LAB_0015c534;
    }
  }
  *(undefined4 *)(in_RDI + 0x180) = local_18;
  uVar2 = PointCloudDecoder::bitstream_version(*(PointCloudDecoder **)(in_RDI + 8));
  if (uVar2 < 0x200) {
    PointCloudDecoder::buffer(*(PointCloudDecoder **)(in_RDI + 8));
    bVar1 = DecoderBuffer::Decode<unsigned_int>
                      ((DecoderBuffer *)
                       CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                       (uint *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
    if (!bVar1) {
      local_1 = 0;
      goto LAB_0015c534;
    }
  }
  else {
    PointCloudDecoder::buffer(*(PointCloudDecoder **)(in_RDI + 8));
    bVar1 = DecodeVarint<unsigned_int>
                      ((uint *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                       (DecoderBuffer *)0x15b5bc);
    if (!bVar1) {
      local_1 = 0;
      goto LAB_0015c534;
    }
  }
  uVar5 = std::numeric_limits<unsigned_int>::max();
  if (uVar5 / 3 < local_1c) {
    local_1 = 0;
    goto LAB_0015c534;
  }
  if (local_1c * 3 < *(uint *)(in_RDI + 0x180)) {
    local_1 = 0;
    goto LAB_0015c534;
  }
  if ((ulong)((long)*(int *)(in_RDI + 0x180) * ((long)*(int *)(in_RDI + 0x180) + -1)) >> 1 <
      (ulong)(local_1c * 3 >> 1)) {
    local_1 = 0;
    goto LAB_0015c534;
  }
  PointCloudDecoder::buffer(*(PointCloudDecoder **)(in_RDI + 8));
  bVar1 = DecoderBuffer::Decode<unsigned_char>
                    ((DecoderBuffer *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                     (uchar *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
  if (!bVar1) {
    local_1 = 0;
    goto LAB_0015c534;
  }
  uVar2 = PointCloudDecoder::bitstream_version(*(PointCloudDecoder **)(in_RDI + 8));
  if (uVar2 < 0x200) {
    PointCloudDecoder::buffer(*(PointCloudDecoder **)(in_RDI + 8));
    bVar1 = DecoderBuffer::Decode<unsigned_int>
                      ((DecoderBuffer *)
                       CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                       (uint *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
    if (!bVar1) {
      local_1 = 0;
      goto LAB_0015c534;
    }
  }
  else {
    PointCloudDecoder::buffer(*(PointCloudDecoder **)(in_RDI + 8));
    bVar1 = DecodeVarint<unsigned_int>
                      ((uint *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                       (DecoderBuffer *)0x15b73a);
    if (!bVar1) {
      local_1 = 0;
      goto LAB_0015c534;
    }
  }
  if (local_1c < local_38) {
    local_1 = 0;
    goto LAB_0015c534;
  }
  if (local_38 + local_38 / 3 < local_1c) {
    local_1 = 0;
    goto LAB_0015c534;
  }
  uVar2 = PointCloudDecoder::bitstream_version(*(PointCloudDecoder **)(in_RDI + 8));
  if (uVar2 < 0x200) {
    PointCloudDecoder::buffer(*(PointCloudDecoder **)(in_RDI + 8));
    bVar1 = DecoderBuffer::Decode<unsigned_int>
                      ((DecoderBuffer *)
                       CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                       (uint *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
    if (!bVar1) {
      local_1 = 0;
      goto LAB_0015c534;
    }
  }
  else {
    PointCloudDecoder::buffer(*(PointCloudDecoder **)(in_RDI + 8));
    bVar1 = DecodeVarint<unsigned_int>
                      ((uint *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                       (DecoderBuffer *)0x15b827);
    if (!bVar1) {
      local_1 = 0;
      goto LAB_0015c534;
    }
  }
  if (local_38 < local_40) {
    local_1 = 0;
    goto LAB_0015c534;
  }
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x15b868);
  operator_new(0xa8);
  CornerTable::CornerTable(in_stack_fffffffffffffdf0);
  std::unique_ptr<draco::CornerTable,std::default_delete<draco::CornerTable>>::
  unique_ptr<std::default_delete<draco::CornerTable>,void>
            ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
             CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
             (pointer)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator=
            ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
             CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
             (unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
             CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::~unique_ptr
            ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
             in_stack_fffffffffffffdd0);
  bVar1 = std::operator==((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                           *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                          (nullptr_t)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  if (bVar1) {
    local_1 = 0;
    goto LAB_0015c534;
  }
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x15b929);
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdf0,
             (size_type)in_stack_fffffffffffffde8);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x15b95a);
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdf0,
             (size_type)in_stack_fffffffffffffde8);
  std::vector<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>::clear
            ((vector<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>
              *)0x15b988);
  std::vector<draco::HoleEventData,_std::allocator<draco::HoleEventData>_>::clear
            ((vector<draco::HoleEventData,_std::allocator<draco::HoleEventData>_> *)0x15b999);
  std::vector<bool,_std::allocator<bool>_>::clear
            ((vector<bool,_std::allocator<bool>_> *)
             CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  std::
  vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  ::clear((vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
           *)0x15b9be);
  *(undefined4 *)(in_RDI + 0xb8) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0xc0) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0xbc) = 0xffffffff;
  std::
  vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
  ::clear((vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
           *)0x15b9f0);
  std::
  vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
  ::resize((vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
            *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
           (size_type)in_stack_fffffffffffffdd8);
  std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
            ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)0x15ba1f);
  bVar1 = CornerTable::Reset(in_stack_fffffffffffffdd8,
                             (int)((ulong)in_stack_fffffffffffffdd0 >> 0x20),
                             (int)in_stack_fffffffffffffdd0);
  if (!bVar1) {
    local_1 = 0;
    goto LAB_0015c534;
  }
  local_55 = 1;
  std::vector<bool,_std::allocator<bool>_>::assign
            ((vector<bool,_std::allocator<bool>_> *)
             CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
             CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),(bool *)0x15ba8c);
  local_5c = -1;
  uVar2 = PointCloudDecoder::bitstream_version(*(PointCloudDecoder **)(in_RDI + 8));
  if (uVar2 < 0x202) {
    uVar2 = PointCloudDecoder::bitstream_version(*(PointCloudDecoder **)(in_RDI + 8));
    if (uVar2 < 0x200) {
      PointCloudDecoder::buffer(*(PointCloudDecoder **)(in_RDI + 8));
      bVar1 = DecoderBuffer::Decode<unsigned_int>
                        ((DecoderBuffer *)
                         CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                         (uint *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
      if (!bVar1) {
        local_1 = 0;
        goto LAB_0015c534;
      }
    }
    else {
      PointCloudDecoder::buffer(*(PointCloudDecoder **)(in_RDI + 8));
      bVar1 = DecodeVarint<unsigned_int>
                        ((uint *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                         (DecoderBuffer *)0x15bb26);
      if (!bVar1) {
        local_1 = 0;
        goto LAB_0015c534;
      }
    }
    if (local_60 != 0) {
      in_stack_fffffffffffffeb0 = (ulong)local_60;
      pDVar9 = PointCloudDecoder::buffer(*(PointCloudDecoder **)(in_RDI + 8));
      iVar10 = DecoderBuffer::remaining_size(pDVar9);
      if ((long)in_stack_fffffffffffffeb0 <= iVar10) {
        DecoderBuffer::DecoderBuffer
                  ((DecoderBuffer *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
        in_stack_fffffffffffffea8 =
             (MeshAttributeCornerTable *)
             PointCloudDecoder::buffer(*(PointCloudDecoder **)(in_RDI + 8));
        pcVar11 = DecoderBuffer::data_head((DecoderBuffer *)in_stack_fffffffffffffea8);
        uVar12 = (ulong)local_60;
        pDVar9 = PointCloudDecoder::buffer(*(PointCloudDecoder **)(in_RDI + 8));
        iVar10 = DecoderBuffer::remaining_size(pDVar9);
        pDVar9 = PointCloudDecoder::buffer(*(PointCloudDecoder **)(in_RDI + 8));
        uVar2 = DecoderBuffer::bitstream_version(pDVar9);
        DecoderBuffer::Init(&local_98,pcVar11 + uVar12,iVar10 - (ulong)local_60,uVar2);
        local_5c = DecodeHoleAndTopologySplitEvents
                             ((MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>
                               *)CONCAT26(in_stack_fffffffffffffe2e,
                                          CONCAT24(in_stack_fffffffffffffe2c,
                                                   in_stack_fffffffffffffe28)),
                              in_stack_fffffffffffffe20);
        if (local_5c == -1) {
          local_1 = 0;
        }
        local_9c = (uint)(local_5c == -1);
        DecoderBuffer::~DecoderBuffer((DecoderBuffer *)0x15bd12);
        if (local_9c != 0) goto LAB_0015c534;
        goto LAB_0015bd5b;
      }
    }
    local_1 = 0;
  }
  else {
    PointCloudDecoder::buffer(*(PointCloudDecoder **)(in_RDI + 8));
    iVar6 = DecodeHoleAndTopologySplitEvents
                      ((MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>
                        *)CONCAT26(in_stack_fffffffffffffe2e,
                                   CONCAT24(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28)),
                       in_stack_fffffffffffffe20);
    if (iVar6 == -1) {
      local_1 = 0;
      goto LAB_0015c534;
    }
LAB_0015bd5b:
    MeshEdgebreakerTraversalPredictiveDecoder::Init
              ((MeshEdgebreakerTraversalPredictiveDecoder *)
               CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
               (MeshEdgebreakerDecoderImplInterface *)
               CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
    MeshEdgebreakerTraversalPredictiveDecoder::SetNumEncodedVertices
              ((MeshEdgebreakerTraversalPredictiveDecoder *)(in_RDI + 0x210),
               *(int *)(in_RDI + 0x180) + local_40);
    MeshEdgebreakerTraversalDecoder::SetNumAttributeData
              ((MeshEdgebreakerTraversalDecoder *)(in_RDI + 0x210),(uint)local_31);
    DecoderBuffer::DecoderBuffer
              ((DecoderBuffer *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
    bVar1 = MeshEdgebreakerTraversalPredictiveDecoder::Start
                      ((MeshEdgebreakerTraversalPredictiveDecoder *)
                       CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                       (DecoderBuffer *)
                       CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
    if (bVar1) {
      local_dc = DecodeConnectivity(in_stack_00000658,in_stack_00000654);
      if (local_dc == -1) {
        local_1 = 0;
      }
      else {
        pDVar9 = PointCloudDecoder::buffer(*(PointCloudDecoder **)(in_RDI + 8));
        pcVar11 = DecoderBuffer::data_head(&local_d8);
        data_size = DecoderBuffer::remaining_size(&local_d8);
        this_00 = PointCloudDecoder::buffer(*(PointCloudDecoder **)(in_RDI + 8));
        uVar2 = DecoderBuffer::bitstream_version(this_00);
        DecoderBuffer::Init(pDVar9,pcVar11,data_size,uVar2);
        uVar3 = PointCloudDecoder::bitstream_version(*(PointCloudDecoder **)(in_RDI + 8));
        if (uVar3 < 0x202) {
          in_stack_fffffffffffffe20 = PointCloudDecoder::buffer(*(PointCloudDecoder **)(in_RDI + 8))
          ;
          DecoderBuffer::Advance(in_stack_fffffffffffffe20,(long)local_5c);
        }
        bVar1 = std::
                vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
                ::empty(in_stack_fffffffffffffdd0);
        if (!bVar1) {
          uVar4 = PointCloudDecoder::bitstream_version(*(PointCloudDecoder **)(in_RDI + 8));
          if (uVar4 < 0x201) {
            IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::IndexType(&local_e0,0);
            while( true ) {
              std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::
              operator->((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *
                         )0x15bfd7);
              uVar5 = CornerTable::num_corners((CornerTable *)0x15bfdf);
              local_e4 = uVar5;
              bVar1 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator<
                                (&local_e0,&local_e4);
              if (!bVar1) break;
              local_e8 = local_e0.value_;
              bVar1 = DecodeAttributeConnectivitiesOnFaceLegacy
                                ((MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>
                                  *)CONCAT26(uVar4,CONCAT24(in_stack_fffffffffffffe1c,uVar5)),
                                 (CornerIndex)(uint)((ulong)in_stack_fffffffffffffe20 >> 0x20));
              if (!bVar1) {
                local_1 = 0;
                goto LAB_0015c527;
              }
              local_ec = 3;
              local_f0 = (uint)IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator+=
                                         (&local_e0,&local_ec);
            }
          }
          else {
            IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::IndexType(&local_f4,0);
            while( true ) {
              std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::
              operator->((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *
                         )0x15c0c3);
              local_f8 = CornerTable::num_corners((CornerTable *)0x15c0cb);
              bVar1 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator<
                                (&local_f4,&local_f8);
              if (!bVar1) break;
              local_fc = local_f4.value_;
              bVar1 = DecodeAttributeConnectivitiesOnFace
                                ((MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>
                                  *)CONCAT26(uVar2,CONCAT24(uVar3,in_stack_fffffffffffffe28)),
                                 (CornerIndex)(uint)((ulong)this_00 >> 0x20));
              if (!bVar1) {
                local_1 = 0;
                goto LAB_0015c527;
              }
              local_100 = 3;
              local_104 = (uint)IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator+=
                                          (&local_f4,&local_100);
            }
          }
        }
        MeshEdgebreakerTraversalDecoder::Done
                  ((MeshEdgebreakerTraversalDecoder *)
                   CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
        for (local_108 = 0; uVar12 = (ulong)local_108,
            sVar13 = std::
                     vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
                     ::size((vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
                             *)(in_RDI + 0x1f8)), uVar12 < sVar13; local_108 = local_108 + 1) {
          std::
          vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
          ::operator[]((vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
                        *)(in_RDI + 0x1f8),(ulong)local_108);
          std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::get
                    ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
                     CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
          MeshAttributeCornerTable::InitEmpty
                    (in_stack_fffffffffffffde8,
                     (CornerTable *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
          pvVar14 = std::
                    vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
                    ::operator[]((vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
                                  *)(in_RDI + 0x1f8),(ulong)local_108);
          local_110 = &pvVar14->attribute_seam_corners;
          local_118._M_current =
               (int *)std::vector<int,_std::allocator<int>_>::begin
                                ((vector<int,_std::allocator<int>_> *)
                                 CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
          local_120 = (int *)std::vector<int,_std::allocator<int>_>::end
                                       ((vector<int,_std::allocator<int>_> *)
                                        CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8
                                                ));
          while (bVar1 = __gnu_cxx::operator!=
                                   ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                     *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0)
                                    ,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                      *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8
                                                )), bVar1) {
            puVar15 = (uint *)__gnu_cxx::
                              __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                              operator*(&local_118);
            local_124 = *puVar15;
            pvVar14 = std::
                      vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
                      ::operator[]((vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
                                    *)(in_RDI + 0x1f8),(ulong)local_108);
            in_stack_fffffffffffffde8 = &pvVar14->connectivity_data;
            IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::IndexType(&local_128,local_124);
            MeshAttributeCornerTable::AddSeamEdge
                      (in_stack_fffffffffffffea8,
                       (CornerIndex)(uint)(in_stack_fffffffffffffeb0 >> 0x20));
            __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                      (&local_118);
          }
          std::
          vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
          ::operator[]((vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
                        *)(in_RDI + 0x1f8),(ulong)local_108);
          bVar1 = MeshAttributeCornerTable::RecomputeVertices
                            ((MeshAttributeCornerTable *)
                             CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                             (Mesh *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                             (PointAttribute *)
                             CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
          in_stack_fffffffffffffde4 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffde4);
          if (!bVar1) {
            local_1 = 0;
            goto LAB_0015c527;
          }
        }
        std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
                  ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
                   0x15c39a);
        CornerTable::num_vertices((CornerTable *)0x15c3a2);
        MeshAttributeIndicesEncodingData::Init
                  ((MeshAttributeIndicesEncodingData *)
                   CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                   in_stack_fffffffffffffdbc);
        local_12c = 0;
        while( true ) {
          uVar12 = (ulong)local_12c;
          sVar13 = std::
                   vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
                   ::size((vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
                           *)(in_RDI + 0x1f8));
          if (sVar13 <= uVar12) break;
          std::
          vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
          ::operator[]((vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
                        *)(in_RDI + 0x1f8),(ulong)local_12c);
          iVar7 = MeshAttributeCornerTable::num_vertices((MeshAttributeCornerTable *)0x15c41d);
          std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
                    ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
                     0x15c44a);
          iVar8 = CornerTable::num_vertices((CornerTable *)0x15c452);
          if (iVar7 < iVar8) {
            std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::
            operator->((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
                       0x15c475);
            in_stack_fffffffffffffdc0 = CornerTable::num_vertices((CornerTable *)0x15c47d);
          }
          std::
          vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
          ::operator[]((vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
                        *)(in_RDI + 0x1f8),(ulong)local_12c);
          MeshAttributeIndicesEncodingData::Init
                    ((MeshAttributeIndicesEncodingData *)CONCAT44(iVar7,in_stack_fffffffffffffdc0),
                     in_stack_fffffffffffffdbc);
          local_12c = local_12c + 1;
        }
        bVar1 = AssignPointsToCorners(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
        if (bVar1) {
          local_1 = 1;
        }
        else {
          local_1 = 0;
        }
      }
    }
    else {
      local_1 = 0;
    }
LAB_0015c527:
    local_9c = 1;
    DecoderBuffer::~DecoderBuffer((DecoderBuffer *)0x15c534);
  }
LAB_0015c534:
  return (bool)(local_1 & 1);
}

Assistant:

bool MeshEdgebreakerDecoderImpl<TraversalDecoder>::DecodeConnectivity() {
  num_new_vertices_ = 0;
  new_to_parent_vertex_map_.clear();
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 2)) {
    uint32_t num_new_verts;
    if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 0)) {
      if (!decoder_->buffer()->Decode(&num_new_verts)) {
        return false;
      }
    } else {
      if (!DecodeVarint(&num_new_verts, decoder_->buffer())) {
        return false;
      }
    }
    num_new_vertices_ = num_new_verts;
  }
#endif

  uint32_t num_encoded_vertices;
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 0)) {
    if (!decoder_->buffer()->Decode(&num_encoded_vertices)) {
      return false;
    }

  } else
#endif
  {
    if (!DecodeVarint(&num_encoded_vertices, decoder_->buffer())) {
      return false;
    }
  }
  num_encoded_vertices_ = num_encoded_vertices;

  uint32_t num_faces;
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 0)) {
    if (!decoder_->buffer()->Decode(&num_faces)) {
      return false;
    }

  } else
#endif
  {
    if (!DecodeVarint(&num_faces, decoder_->buffer())) {
      return false;
    }
  }
  if (num_faces > std::numeric_limits<CornerIndex::ValueType>::max() / 3) {
    return false;  // Draco cannot handle this many faces.
  }

  if (static_cast<uint32_t>(num_encoded_vertices_) > num_faces * 3) {
    return false;  // There cannot be more vertices than 3 * num_faces.
  }

  // Minimum number of edges of the mesh assuming each edge is shared between
  // two faces.
  const uint32_t min_num_face_edges = 3 * num_faces / 2;

  // Maximum number of edges that can exist between |num_encoded_vertices_|.
  // This is based on graph theory assuming simple connected graph.
  const uint64_t num_encoded_vertices_64 =
      static_cast<uint64_t>(num_encoded_vertices_);
  const uint64_t max_num_vertex_edges =
      num_encoded_vertices_64 * (num_encoded_vertices_64 - 1) / 2;
  if (max_num_vertex_edges < min_num_face_edges) {
    // It is impossible to construct a manifold mesh with these properties.
    return false;
  }

  uint8_t num_attribute_data;
  if (!decoder_->buffer()->Decode(&num_attribute_data)) {
    return false;
  }

  uint32_t num_encoded_symbols;
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 0)) {
    if (!decoder_->buffer()->Decode(&num_encoded_symbols)) {
      return false;
    }

  } else
#endif
  {
    if (!DecodeVarint(&num_encoded_symbols, decoder_->buffer())) {
      return false;
    }
  }

  if (num_faces < num_encoded_symbols) {
    // Number of faces needs to be the same or greater than the number of
    // symbols (it can be greater because the initial face may not be encoded as
    // a symbol).
    return false;
  }
  const uint32_t max_encoded_faces =
      num_encoded_symbols + (num_encoded_symbols / 3);
  if (num_faces > max_encoded_faces) {
    // Faces can only be 1 1/3 times bigger than number of encoded symbols. This
    // could only happen if all new encoded components started with interior
    // triangles. E.g. A mesh with multiple tetrahedrons.
    return false;
  }

  uint32_t num_encoded_split_symbols;
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 0)) {
    if (!decoder_->buffer()->Decode(&num_encoded_split_symbols)) {
      return false;
    }

  } else
#endif
  {
    if (!DecodeVarint(&num_encoded_split_symbols, decoder_->buffer())) {
      return false;
    }
  }

  if (num_encoded_split_symbols > num_encoded_symbols) {
    return false;  // Split symbols are a sub-set of all symbols.
  }

  // Decode topology (connectivity).
  vertex_traversal_length_.clear();
  corner_table_ = std::unique_ptr<CornerTable>(new CornerTable());
  if (corner_table_ == nullptr) {
    return false;
  }
  processed_corner_ids_.clear();
  processed_corner_ids_.reserve(num_faces);
  processed_connectivity_corners_.clear();
  processed_connectivity_corners_.reserve(num_faces);
  topology_split_data_.clear();
  hole_event_data_.clear();
  init_face_configurations_.clear();
  init_corners_.clear();

  last_symbol_id_ = -1;
  last_face_id_ = -1;
  last_vert_id_ = -1;

  attribute_data_.clear();
  // Add one attribute data for each attribute decoder.
  attribute_data_.resize(num_attribute_data);

  if (!corner_table_->Reset(
          num_faces, num_encoded_vertices_ + num_encoded_split_symbols)) {
    return false;
  }

  // Start with all vertices marked as holes (boundaries).
  // Only vertices decoded with TOPOLOGY_C symbol (and the initial face) will
  // be marked as non hole vertices. We need to allocate the array larger
  // because split symbols can create extra vertices during the decoding
  // process (these extra vertices are then eliminated during deduplication).
  is_vert_hole_.assign(num_encoded_vertices_ + num_encoded_split_symbols, true);

#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  int32_t topology_split_decoded_bytes = -1;
  if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 2)) {
    uint32_t encoded_connectivity_size;
    if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 0)) {
      if (!decoder_->buffer()->Decode(&encoded_connectivity_size)) {
        return false;
      }
    } else {
      if (!DecodeVarint(&encoded_connectivity_size, decoder_->buffer())) {
        return false;
      }
    }
    if (encoded_connectivity_size == 0 ||
        encoded_connectivity_size > decoder_->buffer()->remaining_size()) {
      return false;
    }
    DecoderBuffer event_buffer;
    event_buffer.Init(
        decoder_->buffer()->data_head() + encoded_connectivity_size,
        decoder_->buffer()->remaining_size() - encoded_connectivity_size,
        decoder_->buffer()->bitstream_version());
    // Decode hole and topology split events.
    topology_split_decoded_bytes =
        DecodeHoleAndTopologySplitEvents(&event_buffer);
    if (topology_split_decoded_bytes == -1) {
      return false;
    }

  } else
#endif
  {
    if (DecodeHoleAndTopologySplitEvents(decoder_->buffer()) == -1) {
      return false;
    }
  }

  traversal_decoder_.Init(this);
  // Add one extra vertex for each split symbol.
  traversal_decoder_.SetNumEncodedVertices(num_encoded_vertices_ +
                                           num_encoded_split_symbols);
  traversal_decoder_.SetNumAttributeData(num_attribute_data);

  DecoderBuffer traversal_end_buffer;
  if (!traversal_decoder_.Start(&traversal_end_buffer)) {
    return false;
  }

  const int num_connectivity_verts = DecodeConnectivity(num_encoded_symbols);
  if (num_connectivity_verts == -1) {
    return false;
  }

  // Set the main buffer to the end of the traversal.
  decoder_->buffer()->Init(traversal_end_buffer.data_head(),
                           traversal_end_buffer.remaining_size(),
                           decoder_->buffer()->bitstream_version());

#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 2)) {
    // Skip topology split data that was already decoded earlier.
    decoder_->buffer()->Advance(topology_split_decoded_bytes);
  }
#endif

  // Decode connectivity of non-position attributes.
  if (!attribute_data_.empty()) {
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
    if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 1)) {
      for (CornerIndex ci(0); ci < corner_table_->num_corners(); ci += 3) {
        if (!DecodeAttributeConnectivitiesOnFaceLegacy(ci)) {
          return false;
        }
      }

    } else
#endif
    {
      for (CornerIndex ci(0); ci < corner_table_->num_corners(); ci += 3) {
        if (!DecodeAttributeConnectivitiesOnFace(ci)) {
          return false;
        }
      }
    }
  }
  traversal_decoder_.Done();

  // Decode attribute connectivity.
  // Prepare data structure for decoding non-position attribute connectivity.
  for (uint32_t i = 0; i < attribute_data_.size(); ++i) {
    attribute_data_[i].connectivity_data.InitEmpty(corner_table_.get());
    // Add all seams.
    for (int32_t c : attribute_data_[i].attribute_seam_corners) {
      attribute_data_[i].connectivity_data.AddSeamEdge(CornerIndex(c));
    }
    // Recompute vertices from the newly added seam edges.
    if (!attribute_data_[i].connectivity_data.RecomputeVertices(nullptr,
                                                                nullptr)) {
      return false;
    }
  }

  pos_encoding_data_.Init(corner_table_->num_vertices());
  for (uint32_t i = 0; i < attribute_data_.size(); ++i) {
    // For non-position attributes, preallocate the vertex to value mapping
    // using the maximum number of vertices from the base corner table and the
    // attribute corner table (since the attribute decoder may use either of
    // it).
    int32_t att_connectivity_verts =
        attribute_data_[i].connectivity_data.num_vertices();
    if (att_connectivity_verts < corner_table_->num_vertices()) {
      att_connectivity_verts = corner_table_->num_vertices();
    }
    attribute_data_[i].encoding_data.Init(att_connectivity_verts);
  }
  if (!AssignPointsToCorners(num_connectivity_verts)) {
    return false;
  }
  return true;
}